

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.cpp
# Opt level: O0

int luaD_precall(lua_State *L,StkId func,int nresults)

{
  Proto *p_00;
  StkId pTVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  StkId pTVar5;
  CallInfo *local_78;
  StkId local_70;
  CallInfo *local_68;
  Proto *p;
  StkId base;
  ptrdiff_t funcr;
  int n;
  CallInfo *ci;
  lua_CFunction f;
  int nresults_local;
  StkId func_local;
  lua_State *L_local;
  
  lVar4 = (long)func - (long)L->stack;
  uVar2 = func->tt_ & 0x3f;
  if (uVar2 == 6) {
    p_00 = *(Proto **)((func->value_).f + 0x18);
    if ((long)L->stack_last - (long)L->top >> 4 <= (long)(ulong)p_00->maxstacksize) {
      luaD_growstack(L,(uint)p_00->maxstacksize);
    }
    pTVar5 = (StkId)((long)L->stack + lVar4);
    for (funcr._4_4_ = (int)((long)L->top - (long)pTVar5 >> 4) + -1;
        funcr._4_4_ < (int)(uint)p_00->numparams; funcr._4_4_ = funcr._4_4_ + 1) {
      pTVar1 = L->top;
      L->top = pTVar1 + 1;
      pTVar1->tt_ = 0;
    }
    if (p_00->is_vararg == '\0') {
      local_70 = pTVar5 + 1;
    }
    else {
      local_70 = adjust_varargs(L,p_00,funcr._4_4_);
    }
    if (L->ci->next == (CallInfo *)0x0) {
      local_78 = luaE_extendCI(L);
    }
    else {
      local_78 = L->ci->next;
    }
    L->ci = local_78;
    local_78->nresults = (short)nresults;
    local_78->func = pTVar5;
    (local_78->u).l.base = local_70;
    local_78->top = local_70 + (int)(uint)p_00->maxstacksize;
    (local_78->u).l.savedpc = p_00->code;
    local_78->callstatus = '\x01';
    L->top = local_78->top;
    if ((L->hookmask & 1) != 0) {
      callhook(L,local_78);
    }
    L_local._4_4_ = 0;
  }
  else {
    if (uVar2 == 0x16) {
      ci = (CallInfo *)(func->value_).gc;
    }
    else {
      if (uVar2 != 0x26) {
        pTVar5 = tryfuncTM(L,func);
        iVar3 = luaD_precall(L,pTVar5,nresults);
        return iVar3;
      }
      ci = *(CallInfo **)((func->value_).f + 0x18);
    }
    if ((long)L->stack_last - (long)L->top >> 4 < 0x15) {
      luaD_growstack(L,0x14);
    }
    if (L->ci->next == (CallInfo *)0x0) {
      local_68 = luaE_extendCI(L);
    }
    else {
      local_68 = L->ci->next;
    }
    L->ci = local_68;
    local_68->nresults = (short)nresults;
    local_68->func = (StkId)((long)L->stack + lVar4);
    local_68->top = L->top + 0x14;
    local_68->callstatus = '\0';
    if ((L->hookmask & 1) != 0) {
      luaD_hook(L,0,-1);
    }
    iVar3 = (*(code *)ci)(L);
    luaD_poscall(L,L->top + -(long)iVar3);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

int luaD_precall (lua_State *L, StkId func, int nresults) {
  lua_CFunction f;
  CallInfo *ci;
  int n;  /* number of arguments (Lua) or returns (C) */
  ptrdiff_t funcr = savestack(L, func);
  switch (ttype(func)) {
    case LUA_TLCF:  /* light C function */
      f = fvalue(func);
      goto Cfunc;
    case LUA_TCCL: {  /* C closure */
      f = clCvalue(func)->f;
     Cfunc:
      luaD_checkstack(L, LUA_MINSTACK);  /* ensure minimum stack size */
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = restorestack(L, funcr);
      ci->top = L->top + LUA_MINSTACK;
      lua_assert(ci->top <= L->stack_last);
      ci->callstatus = 0;
      if (L->hookmask & LUA_MASKCALL)
        luaD_hook(L, LUA_HOOKCALL, -1);
      lua_unlock(L);
      n = (*f)(L);  /* do the actual call */
      lua_lock(L);
      api_checknelems(L, n);
      luaD_poscall(L, L->top - n);
      return 1;
    }
    case LUA_TLCL: {  /* Lua function: prepare its call */
      StkId base;
      Proto *p = clLvalue(func)->p;
      luaD_checkstack(L, p->maxstacksize);
      func = restorestack(L, funcr);
      n = cast_int(L->top - func) - 1;  /* number of real arguments */
      for (; n < p->numparams; n++)
        setnilvalue(L->top++);  /* complete missing arguments */
      base = (!p->is_vararg) ? func + 1 : adjust_varargs(L, p, n);
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = func;
      ci->u.l.base = base;
      ci->top = base + p->maxstacksize;
      lua_assert(ci->top <= L->stack_last);
      ci->u.l.savedpc = p->code;  /* starting point */
      ci->callstatus = CIST_LUA;
      L->top = ci->top;
      if (L->hookmask & LUA_MASKCALL)
        callhook(L, ci);
      return 0;
    }
    default: {  /* not a function */
      func = tryfuncTM(L, func);  /* retry with 'function' tag method */
      return luaD_precall(L, func, nresults);  /* now it must be a function */
    }
  }
}